

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldConvertors.h
# Opt level: O2

uint FIX::IntTConvertor<unsigned_int>::convert(string *value)

{
  const_iterator str;
  bool bVar1;
  uint in_EAX;
  FieldConvertError *this;
  ulong uStack_18;
  uint result;
  
  uStack_18 = (ulong)in_EAX;
  str._M_current = (value->_M_dataplus)._M_p;
  bVar1 = convert(str,(const_iterator)(str._M_current + value->_M_string_length),&result);
  if (bVar1) {
    return result;
  }
  this = (FieldConvertError *)__cxa_allocate_exception(0x50);
  FieldConvertError::FieldConvertError(this,value);
  __cxa_throw(this,&FieldConvertError::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(FieldConvertError) {
    T result = 0;
    if (!convert(value.begin(), value.end(), result)) {
      throw FieldConvertError(value);
    } else {
      return result;
    }
  }